

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadStream.cpp
# Opt level: O2

ssize_t __thiscall ReadStream::read(ReadStream *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  char ch;
  uchar local_2a;
  uchar local_29;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__fd);
  uVar5 = __nbytes & 0xffffffff;
  iVar4 = (int)__nbytes;
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::seekg(plVar6,(long)(int)__buf,0);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 2) == 0) {
      iVar3 = 0;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      if (*(int *)((long)plVar6 + 0x20c) < iVar4) {
        iVar3 = 0;
      }
      iVar3 = *(int *)((long)plVar6 + 0x20c) - iVar3;
      *(int *)((long)plVar6 + 0x20c) = iVar3;
      if (iVar4 <= iVar3) {
        while( true ) {
          plVar2 = (long *)std::istream::get((char *)plVar6);
          iVar4 = (int)uVar5;
          if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) ||
             (iVar4 < 1)) break;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_29);
          uVar5 = (ulong)(iVar4 - 1);
        }
        if ((0 < *(int *)((long)plVar6 + 0x20c)) &&
           (*(long *)&this->field_0x8 == *(long *)this && 0 < iVar4)) {
          iVar4 = iVar4 + 1;
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_2a);
            iVar4 = iVar4 + -1;
          } while (1 < iVar4);
        }
      }
    }
  }
  return (ssize_t)this;
}

Assistant:

vector<unsigned char> ReadStream::read(int position, int count) {
        vector<unsigned char> ivector;

        if(!f.is_open())
            return ivector;

        f.seekg(position);
        if(f.eof())
            return ivector;

        size = (count > size || count < 0) ? size : size - count;
        if(count <= size) {
            char ch;
            while (f.get(ch) && count > 0) {
                ivector.push_back(ch);
                --count;
            }
            if(size > 0 && ivector.size() == 0) {
                while (count > 0) {
                    ivector.push_back(ch);
                    --count;
                }
            }
        }
        return ivector;
    }